

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void SHA1Transform(uint32_t *state,uchar *buffer)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint local_78;
  uint local_74;
  CHAR64LONG16 block [1];
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uchar *buffer_local;
  uint32_t *state_local;
  
  memcpy(&local_78,buffer,0x40);
  uVar4 = *state;
  uVar2 = state[1];
  uVar5 = state[2];
  uVar3 = state[3];
  uVar6 = local_78 << 0x18 | local_78 >> 8 & 0xff00ff00 |
          (local_78 & 0xff00) << 8 | local_78 >> 0x18;
  uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar6 + 0x5a827999 + (uVar4 << 5 | uVar4 >> 0x1b) +
          state[4];
  uVar2 = uVar2 << 0x1e | uVar2 >> 2;
  uVar7 = local_74 << 0x18 | local_74 >> 8 & 0xff00ff00 |
          (local_74 & 0xff00) << 8 | local_74 >> 0x18;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar7 + 0x5a827999 + (uVar1 * 0x20 | uVar1 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 << 0x1e | uVar4 >> 2;
  uVar8 = block[0].l[0] << 0x18 | (uint)block[0]._0_4_ >> 8 & 0xff00ff00 |
          (block[0].l[0] & 0xff00) << 8 | (uint)block[0]._0_4_ >> 0x18;
  uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + uVar8 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar9 = block[0].l[1] << 0x18 | (uint)block[0]._4_4_ >> 8 & 0xff00ff00 |
          (block[0].l[1] & 0xff00) << 8 | (uint)block[0]._4_4_ >> 0x18;
  uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + uVar9 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar10 = block[0].l[2] << 0x18 | (uint)block[0]._8_4_ >> 8 & 0xff00ff00 |
           (block[0].l[2] & 0xff00) << 8 | (uint)block[0]._8_4_ >> 0x18;
  uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + uVar10 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar11 = block[0].l[3] << 0x18 | (uint)block[0]._12_4_ >> 8 & 0xff00ff00 |
           (block[0].l[3] & 0xff00) << 8 | (uint)block[0]._12_4_ >> 0x18;
  uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar11 + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar12 = block[0].l[4] << 0x18 | (uint)block[0]._16_4_ >> 8 & 0xff00ff00 |
           (block[0].l[4] & 0xff00) << 8 | (uint)block[0]._16_4_ >> 0x18;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar12 + 0x5a827999 + (uVar1 * 0x20 | uVar1 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar13 = block[0].l[5] << 0x18 | (uint)block[0]._20_4_ >> 8 & 0xff00ff00 |
           (block[0].l[5] & 0xff00) << 8 | (uint)block[0]._20_4_ >> 0x18;
  uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + uVar13 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar14 = block[0].l[6] << 0x18 | (uint)block[0]._24_4_ >> 8 & 0xff00ff00 |
           (block[0].l[6] & 0xff00) << 8 | (uint)block[0]._24_4_ >> 0x18;
  uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + uVar14 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar15 = block[0].l[7] << 0x18 | (uint)block[0]._28_4_ >> 8 & 0xff00ff00 |
           (block[0].l[7] & 0xff00) << 8 | (uint)block[0]._28_4_ >> 0x18;
  uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + uVar15 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar16 = block[0].l[8] << 0x18 | (uint)block[0]._32_4_ >> 8 & 0xff00ff00 |
           (block[0].l[8] & 0xff00) << 8 | (uint)block[0]._32_4_ >> 0x18;
  uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar16 + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar17 = block[0].l[9] << 0x18 | (uint)block[0]._36_4_ >> 8 & 0xff00ff00 |
           (block[0].l[9] & 0xff00) << 8 | (uint)block[0]._36_4_ >> 0x18;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar17 + 0x5a827999 + (uVar1 * 0x20 | uVar1 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar18 = block[0].l[10] << 0x18 | (uint)block[0]._40_4_ >> 8 & 0xff00ff00 |
           (block[0].l[10] & 0xff00) << 8 | (uint)block[0]._40_4_ >> 0x18;
  uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + uVar18 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar19 = block[0].l[0xb] << 0x18 | (uint)block[0]._44_4_ >> 8 & 0xff00ff00 |
           (block[0].l[0xb] & 0xff00) << 8 | (uint)block[0]._44_4_ >> 0x18;
  uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + uVar19 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar20 = block[0].l[0xc] << 0x18 | (uint)block[0]._48_4_ >> 8 & 0xff00ff00 |
           (block[0].l[0xc] & 0xff00) << 8 | (uint)block[0]._48_4_ >> 0x18;
  uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + uVar20 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar21 = block[0].l[0xd] << 0x18 | (uint)block[0]._52_4_ >> 8 & 0xff00ff00 |
           (block[0].l[0xd] & 0xff00) << 8 | (uint)block[0]._52_4_ >> 0x18;
  uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar21 + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar6 + 0x5a827999 + (uVar1 * 0x20 | uVar1 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar7 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + uVar7 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar8 = (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + uVar8 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar9 = (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
  uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + uVar9 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar10 = (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar10 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar11 = (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar11 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar12 = (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar12 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar13 = (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar13 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar14 = (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) << 1 | (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar14 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar15 = (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) << 1 | (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) >> 0x1f;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar15 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar16 = (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) << 1 | (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar16 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar17 = (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) << 1 | (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) >> 0x1f;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar17 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar18 = (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) << 1 | (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) >> 0x1f;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar18 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar19 = (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) << 1 | (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar19 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar20 = (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) << 1 | (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) >> 0x1f;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar20 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar21 = (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) << 1 | (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar21 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar6 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar7 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar7 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar8 = (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar8 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar9 = (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar9 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar10 = (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar10 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar11 = (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar11 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar12 = (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar12 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar13 = (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar13 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar14 = (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) << 1 | (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) >> 0x1f;
  uVar1 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar14 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar15 = (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) << 1 | (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) >> 0x1f;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar15 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar16 = (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) << 1 | (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) >> 0x1f;
  uVar5 = ((uVar1 | uVar4) & uVar2 | uVar1 & uVar4) + uVar16 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar17 = (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) << 1 | (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) >> 0x1f;
  uVar2 = ((uVar3 | uVar1) & uVar4 | uVar3 & uVar1) + uVar17 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar18 = (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) << 1 | (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) >> 0x1f;
  uVar4 = ((uVar5 | uVar3) & uVar1 | uVar5 & uVar3) + uVar18 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar19 = (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) << 1 | (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) >> 0x1f;
  uVar1 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar19 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar20 = (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) << 1 | (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) >> 0x1f;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar20 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar21 = (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) << 1 | (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) >> 0x1f;
  uVar5 = ((uVar1 | uVar4) & uVar2 | uVar1 & uVar4) + uVar21 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
  uVar2 = ((uVar3 | uVar1) & uVar4 | uVar3 & uVar1) + uVar6 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar7 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar4 = ((uVar5 | uVar3) & uVar1 | uVar5 & uVar3) + uVar7 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar8 = (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar1 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar8 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar9 = (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (uVar6 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar9 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar10 = (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (uVar7 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
  uVar5 = ((uVar1 | uVar4) & uVar2 | uVar1 & uVar4) + uVar10 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar11 = (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) << 1 | (uVar8 ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
  uVar2 = ((uVar3 | uVar1) & uVar4 | uVar3 & uVar1) + uVar11 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar12 = (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) << 1 | (uVar9 ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
  uVar4 = ((uVar5 | uVar3) & uVar1 | uVar5 & uVar3) + uVar12 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar13 = (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) << 1 | (uVar10 ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar1 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar13 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar14 = (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) << 1 | (uVar11 ^ uVar6 ^ uVar16 ^ uVar14) >> 0x1f;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar14 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar15 = (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) << 1 | (uVar12 ^ uVar7 ^ uVar17 ^ uVar15) >> 0x1f;
  uVar5 = ((uVar1 | uVar4) & uVar2 | uVar1 & uVar4) + uVar15 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar16 = (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) << 1 | (uVar13 ^ uVar8 ^ uVar18 ^ uVar16) >> 0x1f;
  uVar2 = ((uVar3 | uVar1) & uVar4 | uVar3 & uVar1) + uVar16 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar17 = (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) << 1 | (uVar14 ^ uVar9 ^ uVar19 ^ uVar17) >> 0x1f;
  uVar4 = ((uVar5 | uVar3) & uVar1 | uVar5 & uVar3) + uVar17 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar18 = (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) << 1 | (uVar15 ^ uVar10 ^ uVar20 ^ uVar18) >> 0x1f;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar18 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar19 = (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) << 1 | (uVar16 ^ uVar11 ^ uVar21 ^ uVar19) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar19 + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar20 = (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) << 1 | (uVar17 ^ uVar12 ^ uVar6 ^ uVar20) >> 0x1f;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar20 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar21 = (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) << 1 | (uVar18 ^ uVar13 ^ uVar7 ^ uVar21) >> 0x1f;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar21 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  local_78 = (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) << 1 | (uVar19 ^ uVar14 ^ uVar8 ^ uVar6) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + local_78 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  local_74 = (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) << 1 | (uVar20 ^ uVar15 ^ uVar9 ^ uVar7) >> 0x1f;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + local_74 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  block[0]._0_4_ =
       (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) << 1 | (uVar21 ^ uVar16 ^ uVar10 ^ uVar8) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + block[0]._0_4_ + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  block[0]._4_4_ =
       (local_78 ^ uVar17 ^ uVar11 ^ uVar9) << 1 | (local_78 ^ uVar17 ^ uVar11 ^ uVar9) >> 0x1f;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + block[0]._4_4_ + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  block[0]._8_4_ =
       (local_74 ^ uVar18 ^ uVar12 ^ uVar10) << 1 | (local_74 ^ uVar18 ^ uVar12 ^ uVar10) >> 0x1f;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + block[0]._8_4_ + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  block[0]._12_4_ =
       (block[0]._0_4_ ^ uVar19 ^ uVar13 ^ uVar11) << 1 |
       (block[0]._0_4_ ^ uVar19 ^ uVar13 ^ uVar11) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + block[0]._12_4_ + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  block[0]._16_4_ =
       (block[0]._4_4_ ^ uVar20 ^ uVar14 ^ uVar12) << 1 |
       (block[0]._4_4_ ^ uVar20 ^ uVar14 ^ uVar12) >> 0x1f;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + block[0]._16_4_ + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  block[0]._20_4_ =
       (block[0]._8_4_ ^ uVar21 ^ uVar15 ^ uVar13) << 1 |
       (block[0]._8_4_ ^ uVar21 ^ uVar15 ^ uVar13) >> 0x1f;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + block[0]._20_4_ + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  block[0]._24_4_ =
       (block[0]._12_4_ ^ local_78 ^ uVar16 ^ uVar14) << 1 |
       (block[0]._12_4_ ^ local_78 ^ uVar16 ^ uVar14) >> 0x1f;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + block[0]._24_4_ + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  block[0]._28_4_ =
       (block[0]._16_4_ ^ local_74 ^ uVar17 ^ uVar15) << 1 |
       (block[0]._16_4_ ^ local_74 ^ uVar17 ^ uVar15) >> 0x1f;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + block[0]._28_4_ + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  block[0]._32_4_ =
       (block[0]._20_4_ ^ block[0]._0_4_ ^ uVar18 ^ uVar16) << 1 |
       (block[0]._20_4_ ^ block[0]._0_4_ ^ uVar18 ^ uVar16) >> 0x1f;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + block[0]._32_4_ + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  block[0]._36_4_ =
       (block[0]._24_4_ ^ block[0]._4_4_ ^ uVar19 ^ uVar17) << 1 |
       (block[0]._24_4_ ^ block[0]._4_4_ ^ uVar19 ^ uVar17) >> 0x1f;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + block[0]._36_4_ + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar1;
  uVar6 = uVar2 * 0x40000000 | uVar2 >> 2;
  block[0]._40_4_ =
       (block[0]._28_4_ ^ block[0]._8_4_ ^ uVar20 ^ uVar18) << 1 |
       (block[0]._28_4_ ^ block[0]._8_4_ ^ uVar20 ^ uVar18) >> 0x1f;
  uVar3 = (uVar4 ^ uVar6 ^ uVar5) + block[0]._40_4_ + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  block[0]._44_4_ =
       (block[0]._32_4_ ^ block[0]._12_4_ ^ uVar21 ^ uVar19) << 1 |
       (block[0]._32_4_ ^ block[0]._12_4_ ^ uVar21 ^ uVar19) >> 0x1f;
  uVar5 = (uVar1 ^ uVar4 ^ uVar6) + block[0]._44_4_ + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar2 = uVar1 * 0x40000000 | uVar1 >> 2;
  block[0]._48_4_ =
       (block[0]._36_4_ ^ block[0]._16_4_ ^ local_78 ^ uVar20) << 1 |
       (block[0]._36_4_ ^ block[0]._16_4_ ^ local_78 ^ uVar20) >> 0x1f;
  uVar6 = (uVar3 ^ uVar2 ^ uVar4) + block[0]._48_4_ + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar6;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  block[0]._52_4_ =
       (block[0]._40_4_ ^ block[0]._20_4_ ^ local_74 ^ uVar21) << 1 |
       (block[0]._40_4_ ^ block[0]._20_4_ ^ local_74 ^ uVar21) >> 0x1f;
  *state = (uVar5 ^ uVar3 ^ uVar2) + block[0]._52_4_ + -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b)
           + uVar4 + *state;
  state[1] = uVar6 + state[1];
  state[2] = (uVar5 * 0x40000000 | uVar5 >> 2) + state[2];
  state[3] = uVar3 + state[3];
  state[4] = uVar2 + state[4];
  memset(&local_78,0,0x40);
  return;
}

Assistant:

void SHA1Transform(uint32_t state[5], const unsigned char buffer[64])
{
    uint32_t a, b, c, d, e;
    typedef union {
        unsigned char c[64];
        uint32_t l[16];
    } CHAR64LONG16;
#ifdef SHA1HANDSOFF
    CHAR64LONG16 block[1];  /* use array to appear as a pointer */
    memcpy(block, buffer, 64);
#else
    /* The following had better never be used because it causes the
     * pointer-to-const buffer to be cast into a pointer to non-const.
     * And the result is written through.  I threw a "const" in, hoping
     * this will cause a diagnostic.
     */
    CHAR64LONG16* block = (const CHAR64LONG16*)buffer;
#endif
    /* Copy context->state[] to working vars */
    a = state[0];
    b = state[1];
    c = state[2];
    d = state[3];
    e = state[4];
    /* 4 rounds of 20 operations each. Loop unrolled. */
    R0(a,b,c,d,e, 0); R0(e,a,b,c,d, 1); R0(d,e,a,b,c, 2); R0(c,d,e,a,b, 3);
    R0(b,c,d,e,a, 4); R0(a,b,c,d,e, 5); R0(e,a,b,c,d, 6); R0(d,e,a,b,c, 7);
    R0(c,d,e,a,b, 8); R0(b,c,d,e,a, 9); R0(a,b,c,d,e,10); R0(e,a,b,c,d,11);
    R0(d,e,a,b,c,12); R0(c,d,e,a,b,13); R0(b,c,d,e,a,14); R0(a,b,c,d,e,15);
    R1(e,a,b,c,d,16); R1(d,e,a,b,c,17); R1(c,d,e,a,b,18); R1(b,c,d,e,a,19);
    R2(a,b,c,d,e,20); R2(e,a,b,c,d,21); R2(d,e,a,b,c,22); R2(c,d,e,a,b,23);
    R2(b,c,d,e,a,24); R2(a,b,c,d,e,25); R2(e,a,b,c,d,26); R2(d,e,a,b,c,27);
    R2(c,d,e,a,b,28); R2(b,c,d,e,a,29); R2(a,b,c,d,e,30); R2(e,a,b,c,d,31);
    R2(d,e,a,b,c,32); R2(c,d,e,a,b,33); R2(b,c,d,e,a,34); R2(a,b,c,d,e,35);
    R2(e,a,b,c,d,36); R2(d,e,a,b,c,37); R2(c,d,e,a,b,38); R2(b,c,d,e,a,39);
    R3(a,b,c,d,e,40); R3(e,a,b,c,d,41); R3(d,e,a,b,c,42); R3(c,d,e,a,b,43);
    R3(b,c,d,e,a,44); R3(a,b,c,d,e,45); R3(e,a,b,c,d,46); R3(d,e,a,b,c,47);
    R3(c,d,e,a,b,48); R3(b,c,d,e,a,49); R3(a,b,c,d,e,50); R3(e,a,b,c,d,51);
    R3(d,e,a,b,c,52); R3(c,d,e,a,b,53); R3(b,c,d,e,a,54); R3(a,b,c,d,e,55);
    R3(e,a,b,c,d,56); R3(d,e,a,b,c,57); R3(c,d,e,a,b,58); R3(b,c,d,e,a,59);
    R4(a,b,c,d,e,60); R4(e,a,b,c,d,61); R4(d,e,a,b,c,62); R4(c,d,e,a,b,63);
    R4(b,c,d,e,a,64); R4(a,b,c,d,e,65); R4(e,a,b,c,d,66); R4(d,e,a,b,c,67);
    R4(c,d,e,a,b,68); R4(b,c,d,e,a,69); R4(a,b,c,d,e,70); R4(e,a,b,c,d,71);
    R4(d,e,a,b,c,72); R4(c,d,e,a,b,73); R4(b,c,d,e,a,74); R4(a,b,c,d,e,75);
    R4(e,a,b,c,d,76); R4(d,e,a,b,c,77); R4(c,d,e,a,b,78); R4(b,c,d,e,a,79);
    /* Add the working vars back into context.state[] */
    state[0] += a;
    state[1] += b;
    state[2] += c;
    state[3] += d;
    state[4] += e;
    /* Wipe variables */
    a = b = c = d = e = 0;
#ifdef SHA1HANDSOFF
    memset(block, '\0', sizeof(block));
#endif
}